

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_IAB.cpp
# Opt level: O0

MXFReader * __thiscall AS_02::IAB::MXFReader::OpenRead(MXFReader *this,string *filename)

{
  bool bVar1;
  int iVar2;
  h__Reader *phVar3;
  ILogSink *pIVar4;
  Dictionary *d;
  h__Reader *phVar5;
  RuntimeError *pRVar6;
  RuntimeError e;
  undefined1 local_1f0 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  Result_t local_170 [104];
  long local_108;
  InterchangeObject *tmp_iobj;
  Result_t local_88 [8];
  Result_t result;
  string *filename_local;
  MXFReader *this_local;
  
  phVar3 = ASDCP::mem_ptr::operator_cast_to_h__Reader_((mem_ptr *)&filename->_M_string_length);
  if ((phVar3 == (h__Reader *)0x0) ||
     (phVar3 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length),
     phVar3->m_State == ST_READER_BEGIN)) {
    Kumu::Result_t::Result_t(local_88,(Result_t *)Kumu::RESULT_OK);
    phVar3 = (h__Reader *)operator_new(0x508);
    d = (Dictionary *)ASDCP::DefaultCompositeDict();
    h__Reader::h__Reader(phVar3,d,*(IFileReaderFactory **)((long)&filename[1].field_2 + 8));
    ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator=
              ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length,phVar3);
    phVar3 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
    h__AS02Reader::OpenMXFRead((h__AS02Reader *)&tmp_iobj,(string *)phVar3);
    Kumu::Result_t::operator=(local_88,(Result_t *)&tmp_iobj);
    Kumu::Result_t::~Result_t((Result_t *)&tmp_iobj);
    local_108 = 0;
    iVar2 = Kumu::Result_t::operator_cast_to_int(local_88);
    if (-1 < iVar2) {
      phVar3 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
      phVar5 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                         ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
      ASDCP::Dictionary::Type
                ((MDD_t)(phVar5->super_h__AS02Reader).
                        super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                        m_Dict);
      ASDCP::MXF::OP1aHeader::GetMDObjectByType
                ((uchar *)local_170,
                 (InterchangeObject **)
                 &(phVar3->super_h__AS02Reader).
                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                  m_HeaderPart);
      Kumu::Result_t::~Result_t(local_170);
    }
    if (local_108 == 0) {
      pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar4,"IABEssenceDescriptor object not found in IMF/IAB MXF file.\n");
      pRVar6 = (RuntimeError *)__cxa_allocate_exception(0x78);
      Kumu::RuntimeError::RuntimeError(pRVar6,(Result_t *)Kumu::RESULT_FAIL);
      __cxa_throw(pRVar6,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
    }
    phVar3 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
    phVar5 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
    ASDCP::Dictionary::Type
              ((MDD_t)(phVar5->super_h__AS02Reader).
                      super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                      m_Dict);
    ASDCP::MXF::OP1aHeader::GetMDObjectByType
              ((uchar *)&ObjectList.
                         super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                         ._M_impl._M_node._M_size,
               (InterchangeObject **)
               &(phVar3->super_h__AS02Reader).
                super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                m_HeaderPart);
    Kumu::Result_t::~Result_t
              ((Result_t *)
               &ObjectList.
                super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                ._M_impl._M_node._M_size);
    if (local_108 == 0) {
      pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar4,"IABSoundfieldLabelSubDescriptor object not found.\n");
      pRVar6 = (RuntimeError *)__cxa_allocate_exception(0x78);
      Kumu::RuntimeError::RuntimeError(pRVar6,(Result_t *)Kumu::RESULT_FAIL);
      __cxa_throw(pRVar6,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
    }
    std::__cxx11::
    list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
              ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)local_1f0);
    phVar3 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
    phVar5 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
    ASDCP::Dictionary::Type
              ((MDD_t)(phVar5->super_h__AS02Reader).
                      super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                      m_Dict);
    ASDCP::MXF::OP1aHeader::GetMDObjectsByType
              (&e.field_0x70,
               (list *)&(phVar3->super_h__AS02Reader).
                        super_TrackFileReader<ASDCP::MXF::OP1aHeader,_AS_02::MXF::AS02IndexReader>.
                        m_HeaderPart);
    Kumu::Result_t::~Result_t((Result_t *)&e.field_0x70);
    bVar1 = std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                     *)local_1f0);
    if (bVar1) {
      pRVar6 = (RuntimeError *)__cxa_allocate_exception(0x78);
      Kumu::RuntimeError::RuntimeError(pRVar6,(Result_t *)Kumu::RESULT_FAIL);
      __cxa_throw(pRVar6,&Kumu::RuntimeError::typeinfo,Kumu::RuntimeError::~RuntimeError);
    }
    phVar3 = ASDCP::mem_ptr<AS_02::IAB::MXFReader::h__Reader>::operator->
                       ((mem_ptr<AS_02::IAB::MXFReader::h__Reader> *)&filename->_M_string_length);
    phVar3->m_State = ST_READER_READY;
    std::__cxx11::
    list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
              ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)local_1f0);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    Kumu::Result_t::~Result_t(local_88);
  }
  else {
    pIVar4 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar4,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_IAB.cpp"
               ,0x19d);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

Result_t
AS_02::IAB::MXFReader::OpenRead(const std::string& filename) {

  /* are we already running */

  if ( this->m_Reader && this->m_Reader->m_State != ST_READER_BEGIN ) {
    KM_RESULT_STATE_HERE();
    return Kumu::RESULT_STATE;
  }

  Result_t result = Kumu::RESULT_OK;

  /* initialize the writer */

  this->m_Reader = new h__Reader(&DefaultCompositeDict(), m_FileReaderFactory);

  try {

    result = this->m_Reader->OpenMXFRead(filename);

    InterchangeObject* tmp_iobj = 0;

    if ( ASDCP_SUCCESS(result)){
      this->m_Reader->m_HeaderPart.GetMDObjectByType(
        this->m_Reader->m_Dict->Type(MDD_IABEssenceDescriptor).ul,
        &tmp_iobj
    );
    }

    if (!tmp_iobj) {
      DefaultLogSink().Error("IABEssenceDescriptor object not found in IMF/IAB MXF file.\n");
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    this->m_Reader->m_HeaderPart.GetMDObjectByType(
      this->m_Reader->m_Dict->Type(MDD_IABSoundfieldLabelSubDescriptor).ul,
      &tmp_iobj
    );

    if (!tmp_iobj) {
      DefaultLogSink().Error("IABSoundfieldLabelSubDescriptor object not found.\n");
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    std::list<InterchangeObject*> ObjectList;

    this->m_Reader->m_HeaderPart.GetMDObjectsByType(
      this->m_Reader->m_Dict->Type(MDD_Track).ul,
      ObjectList
    );

    if (ObjectList.empty()) {
      throw Kumu::RuntimeError(Kumu::RESULT_FAIL);
    }

    /* invalidate current frame */

    /* we are ready */

    this->m_Reader->m_State = ST_READER_READY;

  } catch (Kumu::RuntimeError e) {

    this->Reset();

    return e.GetResult();
  }

  return RESULT_OK;
}